

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

void SetPointer(FState *state,PFunction *sym,int frame)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Variant *pVVar4;
  CodePointerAlias *other;
  undefined1 local_30 [8];
  MBFParamState newstate;
  uint i;
  int frame_local;
  PFunction *sym_local;
  FState *state_local;
  
  newstate._12_4_ = frame;
  if (sym == (PFunction *)0x0) {
    FState::ClearAction(state);
  }
  else {
    pVVar4 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&sym->Variants,0);
    FState::SetAction(state,pVVar4->Implementation);
    for (newstate.pointer = 0; iVar1 = newstate.pointer,
        uVar3 = TArray<CodePointerAlias,_CodePointerAlias>::Size(&MBFCodePointers),
        (uint)iVar1 < uVar3; newstate.pointer = newstate.pointer + 1) {
      other = TArray<CodePointerAlias,_CodePointerAlias>::operator[]
                        (&MBFCodePointers,(ulong)(uint)newstate.pointer);
      bVar2 = FName::operator==((FName *)&(sym->super_PSymbol).super_DObject.field_0x24,&other->name
                               );
      if (bVar2) {
        newstate.state._0_4_ = newstate.pointer;
        local_30 = (undefined1  [8])state;
        TArray<MBFParamState,_MBFParamState>::Push(&MBFParamStates,(MBFParamState *)local_30);
        return;
      }
    }
  }
  return;
}

Assistant:

static void SetPointer(FState *state, PFunction *sym, int frame = 0)
{
	if (sym == NULL)
	{
		state->ClearAction();
		return;
	}
	else
	{
		state->SetAction(sym->Variants[0].Implementation);

		for (unsigned int i = 0; i < MBFCodePointers.Size(); i++)
		{
			if (sym->SymbolName == MBFCodePointers[i].name)
			{
				MBFParamState newstate;
				newstate.state = state;
				newstate.pointer = i;
				MBFParamStates.Push(newstate);
				break; // No need to cycle through the rest of the list.
			}
		}
	}
}